

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline<nivalis::point>
          (ImDrawList *this,point *points,int points_count,ImU32 col,bool closed,float thickness)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ImVec2 IVar6;
  float *pfVar7;
  uint *puVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float **ppfVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ImDrawVert *pIVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint *puVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float in_XMM6_Da;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  float fVar42;
  float fVar43;
  float d2;
  float fVar44;
  float in_XMM11_Da;
  float fVar45;
  float in_XMM11_Db;
  float fVar46;
  int local_188;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  
  if (1 < points_count) {
    IVar6 = this->_Data->TexUvWhitePixel;
    uVar27 = points_count - 1;
    uVar12 = uVar27;
    if (closed) {
      uVar12 = points_count;
    }
    uVar3 = this->Flags;
    uVar20 = col & 0xffffff;
    uVar25 = (ulong)(uint)points_count;
    if (1.0 < thickness || (uVar3 & 1) == 0) {
      iVar14 = (uVar3 & 1) * 3 + 3;
      iVar18 = 9;
      if ((uVar3 & 1) != 0) {
        thickness = thickness + -1.0;
        iVar18 = 0x1b;
      }
      PrimReserve(this,iVar18 * uVar12,points_count * iVar14);
      fVar34 = thickness * 0.5;
      fVar31 = fVar34 + 1.0;
      if (closed) {
        in_XMM11_Da = *points->x - *points[uVar25 - 1].x;
        in_XMM11_Db = *points->y - *points[uVar25 - 1].y;
        fVar39 = in_XMM11_Da * in_XMM11_Da + in_XMM11_Db * in_XMM11_Db;
        if (0.0 < fVar39) {
          in_XMM11_Da = in_XMM11_Da * (1.0 / SQRT(fVar39));
          in_XMM11_Db = in_XMM11_Db * (1.0 / SQRT(fVar39));
        }
      }
      else {
        fVar39 = 0.0;
      }
      uVar4 = this->_VtxCurrentIdx;
      uVar1 = (uVar3 & 1) * 2 + 2;
      uVar19 = (ulong)uVar1;
      ppfVar16 = &points->y;
      local_188 = 0;
      iVar18 = 0;
      for (uVar28 = 0; uVar25 != uVar28; uVar28 = uVar28 + 1) {
        uVar17 = 0;
        if (uVar25 - 1 != uVar28) {
          uVar17 = (ulong)((int)uVar28 + 1);
        }
        fVar32 = *ppfVar16[-1];
        fVar33 = **ppfVar16;
        fVar40 = fVar32 - *points[uVar17].x;
        fVar41 = fVar33 - *points[uVar17].y;
        fVar44 = fVar40 * fVar40 + fVar41 * fVar41;
        if (0.0 < fVar44) {
          fVar40 = fVar40 * (1.0 / SQRT(fVar44));
          fVar41 = fVar41 * (1.0 / SQRT(fVar44));
        }
        if (uVar28 == 0 && !closed) {
          in_XMM11_Da = -fVar40;
          in_XMM11_Db = -fVar41;
          fVar35 = fVar44;
        }
        else {
          fVar35 = fVar39;
          if (uVar27 == uVar28 && !closed) {
            fVar40 = -in_XMM11_Da;
            fVar41 = -in_XMM11_Db;
            fVar44 = fVar39;
          }
        }
        fVar39 = fVar44;
        fVar44 = -in_XMM11_Db;
        fVar42 = in_XMM11_Da * fVar41 - fVar40 * in_XMM11_Db;
        fVar43 = in_XMM11_Da * fVar40 + fVar41 * in_XMM11_Db;
        if (ABS(fVar42) <= 1e-05) {
          fVar35 = fVar44 * fVar34 + fVar32;
          fVar30 = in_XMM11_Da * fVar34 + fVar33;
          fVar46 = in_XMM11_Db * fVar34 + fVar32;
          fVar45 = -in_XMM11_Da * fVar34 + fVar33;
          if ((uVar3 & 1) != 0) {
            local_128 = fVar44 * fVar31 + fVar32;
            fStack_124 = in_XMM11_Da * fVar31 + fVar33;
            fStack_120 = in_XMM11_Db * fVar31 + fVar32;
            fStack_11c = -in_XMM11_Da * fVar31 + fVar33;
          }
        }
        else {
          fVar45 = fVar34 / fVar42;
          if (1e-05 < fVar43) {
            fVar30 = fVar39;
            if (fVar35 <= fVar39) {
              fVar30 = fVar35;
            }
            fVar35 = ((fVar40 + in_XMM11_Da) * (fVar40 + in_XMM11_Da) +
                     (fVar41 + in_XMM11_Db) * (fVar41 + in_XMM11_Db)) * fVar45 * fVar45;
            if (fVar30 < fVar35) {
              fVar30 = fVar30 / fVar35;
              if (fVar30 < 0.0) {
                fVar30 = sqrtf(fVar30);
              }
              else {
                fVar30 = SQRT(fVar30);
              }
              fVar45 = fVar45 * fVar30;
              fVar33 = **ppfVar16;
              fVar32 = *ppfVar16[-1];
            }
          }
          fVar38 = fVar41 + in_XMM11_Db;
          fVar37 = fVar40 + in_XMM11_Da;
          fVar35 = fVar45 * fVar37 + fVar32;
          fVar30 = fVar45 * fVar38 + fVar33;
          fVar46 = fVar45 * -fVar37 + fVar32;
          fVar45 = fVar45 * -fVar38 + fVar33;
          if ((uVar3 & 1) != 0) {
            fVar36 = fVar31 / fVar42;
            local_128 = fVar37 * fVar36 + fVar32;
            fStack_124 = fVar38 * fVar36 + fVar33;
            fStack_120 = -fVar37 * fVar36 + fVar32;
            fStack_11c = -fVar38 * fVar36 + fVar33;
          }
        }
        iVar13 = ((fVar42 < 0.0) - 1) + (uint)(fVar42 < 0.0);
        uVar17 = uVar19;
        if (1e-05 < fVar43) {
          fVar38 = (float)-iVar13;
          fVar42 = fVar40 + fVar38 * fVar41;
          fVar37 = fVar41 + fVar38 * -fVar40;
          fVar44 = in_XMM11_Da + fVar38 * fVar44;
          in_XMM11_Db = in_XMM11_Db + fVar38 * in_XMM11_Da;
          in_XMM6_Da = fVar42 * fVar34 + fVar32;
          in_XMM6_Db = fVar37 * fVar34 + fVar33;
          in_XMM6_Dc = fVar44 * fVar34 + fVar32;
          in_XMM6_Dd = in_XMM11_Db * fVar34 + fVar33;
          if ((uVar3 & 1) == 0) {
            uVar17 = 3;
          }
          else {
            local_f8 = fVar42 * fVar31 + fVar32;
            fStack_f4 = fVar37 * fVar31 + fVar33;
            fStack_f0 = fVar44 * fVar31 + fVar32;
            fStack_ec = in_XMM11_Db * fVar31 + fVar33;
            uVar17 = 6;
          }
        }
        in_XMM11_Da = -fVar40;
        bVar10 = 1e-05 < fVar43;
        bVar29 = 0 < iVar13;
        bVar9 = iVar13 < 0;
        fVar32 = in_XMM6_Dd;
        fVar33 = in_XMM6_Dc;
        if (!bVar29 || !bVar10) {
          fVar32 = fVar45;
          fVar33 = fVar46;
        }
        fVar40 = in_XMM6_Dd;
        fVar44 = in_XMM6_Dc;
        if (!bVar9 || !bVar10) {
          fVar40 = fVar30;
          fVar44 = fVar35;
        }
        pIVar21 = this->_VtxWritePtr;
        (pIVar21->pos).x = fVar33;
        (pIVar21->pos).y = fVar32;
        pIVar21->uv = IVar6;
        pIVar21 = this->_VtxWritePtr;
        pIVar21->col = col;
        pIVar21[1].pos.x = fVar44;
        pIVar21[1].pos.y = fVar40;
        pIVar21[1].uv = IVar6;
        pIVar21 = this->_VtxWritePtr;
        pIVar21[1].col = col;
        if (1e-05 < fVar43) {
          pIVar21[uVar19].pos.x = in_XMM6_Da;
          pIVar21[uVar19].pos.y = in_XMM6_Db;
          pIVar21[uVar19].uv = IVar6;
          pIVar21 = this->_VtxWritePtr;
          pIVar21[uVar19].col = col;
        }
        if ((uVar3 & 1) != 0) {
          fVar32 = fStack_ec;
          fVar33 = fStack_f0;
          if (!bVar29 || !bVar10) {
            fVar32 = fStack_11c;
            fVar33 = fStack_120;
          }
          fVar40 = fStack_ec;
          fVar44 = fStack_f0;
          if (!bVar9 || !bVar10) {
            fVar40 = fStack_124;
            fVar44 = local_128;
          }
          pIVar21[2].pos.x = fVar33;
          pIVar21[2].pos.y = fVar32;
          pIVar21[2].uv = IVar6;
          pIVar21 = this->_VtxWritePtr;
          pIVar21[2].col = uVar20;
          pIVar21[3].pos.x = fVar44;
          pIVar21[3].pos.y = fVar40;
          pIVar21[3].uv = IVar6;
          pIVar21 = this->_VtxWritePtr;
          pIVar21[3].col = uVar20;
          if (1e-05 < fVar43) {
            pIVar21[5].pos.x = local_f8;
            pIVar21[5].pos.y = fStack_f4;
            pIVar21[5].uv = IVar6;
            pIVar21 = this->_VtxWritePtr;
            pIVar21[5].col = uVar20;
          }
        }
        iVar15 = (int)uVar17;
        this->_VtxWritePtr = pIVar21 + uVar17;
        if (uVar28 < uVar12) {
          uVar5 = this->_VtxCurrentIdx;
          uVar11 = iVar15 + uVar5;
          if (uVar27 <= uVar28) {
            uVar11 = uVar4;
          }
          uVar23 = 0;
          if (bVar29 && bVar10) {
            uVar23 = uVar1;
          }
          uVar23 = uVar23 + uVar5;
          uVar22 = 1;
          if (bVar9 && bVar10) {
            uVar22 = uVar1;
          }
          uVar22 = uVar22 + uVar5;
          uVar24 = uVar11 + 1;
          puVar8 = this->_IdxWritePtr;
          puVar26 = puVar8 + 6;
          *puVar8 = uVar23;
          puVar8[1] = uVar22;
          puVar8[2] = uVar24;
          puVar8[3] = uVar23;
          puVar8[4] = uVar24;
          puVar8[5] = uVar11;
          this->_IdxWritePtr = puVar26;
          if (fVar43 <= 1e-05) {
            local_188 = local_188 + 3;
          }
          else {
            puVar8[6] = uVar23;
            puVar8[7] = uVar22;
            puVar8[8] = uVar5 - (~-iVar13 >> 0x1f);
            puVar26 = puVar8 + 9;
            this->_IdxWritePtr = puVar26;
          }
          if ((uVar3 & 1) != 0) {
            uVar5 = this->_VtxCurrentIdx + 2 +
                    (uint)(bVar29 && bVar10) + (uint)(bVar29 && bVar10) * 2;
            uVar2 = this->_VtxCurrentIdx + 3 + (uint)(bVar9 && bVar10) * 2;
            *puVar26 = uVar5;
            puVar26[1] = uVar23;
            puVar26[2] = uVar11;
            puVar26[3] = uVar5;
            puVar26[4] = uVar11;
            puVar26[5] = uVar11 + 2;
            puVar26[6] = uVar2;
            puVar26[7] = uVar22;
            puVar26[8] = uVar24;
            puVar26[9] = uVar2;
            puVar26[10] = uVar24;
            puVar26[0xb] = uVar11 + 3;
            this->_IdxWritePtr = puVar26 + 0xc;
            if (fVar43 <= 1e-05) {
              local_188 = local_188 + 6;
            }
            else {
              bVar9 = iVar13 < 0;
              iVar13 = 2 - (uint)bVar9;
              puVar26[0xc] = this->_VtxCurrentIdx + iVar13;
              puVar26[0xd] = (uint)bVar9 * 3 + this->_VtxCurrentIdx;
              puVar26[0xe] = this->_VtxCurrentIdx + bVar9 + 4;
              puVar26[0xf] = iVar13 + this->_VtxCurrentIdx;
              puVar26[0x10] = bVar9 + 4 + this->_VtxCurrentIdx;
              puVar26[0x11] = (bVar9 ^ 5) + this->_VtxCurrentIdx;
              this->_IdxWritePtr = puVar26 + 0x12;
            }
          }
        }
        iVar18 = (iVar18 + iVar14) - iVar15;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + iVar15;
        in_XMM11_Db = -fVar41;
        ppfVar16 = ppfVar16 + 3;
      }
      PrimUnreserve(this,local_188,iVar18);
      return;
    }
    PrimReserve(this,uVar12 * 0xc,uVar12 * 6);
    uVar27 = (int)((float)(col >> 0x18) * thickness) << 0x18 | uVar20;
    ppfVar16 = &points->y;
    for (uVar19 = 1; uVar19 - uVar12 != 1; uVar19 = uVar19 + 1) {
      uVar28 = uVar19 & 0xffffffff;
      if (uVar25 == uVar19) {
        uVar28 = 0;
      }
      pfVar7 = *ppfVar16;
      fVar34 = *points[uVar28].y - *pfVar7;
      fVar31 = *points[uVar28].x - *ppfVar16[-1];
      fVar39 = fVar31 * fVar31 + fVar34 * fVar34;
      if (0.0 < fVar39) {
        fVar39 = 1.0 / SQRT(fVar39);
        fVar31 = fVar31 * fVar39;
        fVar34 = fVar34 * fVar39;
      }
      pIVar21 = this->_VtxWritePtr;
      (pIVar21->pos).x = *ppfVar16[-1] + fVar34;
      (pIVar21->pos).y = *pfVar7 - fVar31;
      pIVar21->uv = IVar6;
      pIVar21 = this->_VtxWritePtr;
      pIVar21->col = uVar20;
      pIVar21[1].pos.x = *ppfVar16[-1];
      pIVar21[1].pos.y = **ppfVar16;
      pIVar21[1].uv = IVar6;
      pIVar21 = this->_VtxWritePtr;
      pIVar21[1].col = uVar27;
      pIVar21[2].pos.x = *ppfVar16[-1] - fVar34;
      pIVar21[2].pos.y = **ppfVar16 + fVar31;
      pIVar21[2].uv = IVar6;
      pIVar21 = this->_VtxWritePtr;
      pIVar21[2].col = uVar20;
      pIVar21[3].pos.x = *points[uVar28].x + fVar34;
      pIVar21[3].pos.y = *points[uVar28].y - fVar31;
      pIVar21[3].uv = IVar6;
      pIVar21 = this->_VtxWritePtr;
      pIVar21[3].col = uVar20;
      pIVar21[4].pos.x = *points[uVar28].x;
      pIVar21[4].pos.y = *points[uVar28].y;
      pIVar21[4].uv = IVar6;
      pIVar21 = this->_VtxWritePtr;
      pIVar21[4].col = uVar27;
      pIVar21[5].pos.x = *points[uVar28].x - fVar34;
      pIVar21[5].pos.y = fVar31 + *points[uVar28].y;
      pIVar21[5].uv = IVar6;
      pIVar21 = this->_VtxWritePtr;
      pIVar21[5].col = uVar20;
      this->_VtxWritePtr = pIVar21 + 6;
      uVar3 = this->_VtxCurrentIdx;
      puVar26 = this->_IdxWritePtr;
      *puVar26 = uVar3;
      puVar26[1] = uVar3 + 1;
      puVar26[2] = this->_VtxCurrentIdx + 4;
      uVar3 = this->_VtxCurrentIdx;
      puVar26[3] = uVar3;
      puVar26[4] = uVar3 + 4;
      puVar26[5] = this->_VtxCurrentIdx + 3;
      puVar26[6] = this->_VtxCurrentIdx + 1;
      puVar26[7] = this->_VtxCurrentIdx + 2;
      puVar26[8] = this->_VtxCurrentIdx + 5;
      puVar26[9] = this->_VtxCurrentIdx + 1;
      puVar26[10] = this->_VtxCurrentIdx + 5;
      puVar26[0xb] = this->_VtxCurrentIdx + 4;
      this->_IdxWritePtr = puVar26 + 0xc;
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + 6;
      ppfVar16 = ppfVar16 + 3;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const Vec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count; // segment count
    if (!closed)
        count = points_count -1 ;

    const bool antialias = Flags & ImDrawListFlags_AntiAliasedLines;
    const float AA_SIZE = 1.0f;
    const ImU32 col_trans = col & ~IM_COL32_A_MASK;

    if (antialias && thickness <= 1.0f)
    {
        // Anti-aliased stroke approximation
        const int idx_count = count*12;
        const int vtx_count = count*6;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);
        const ImU32 col_faded = (col & ~IM_COL32_A_MASK) | ((int)(((col >> IM_COL32_A_SHIFT) & 0xFF) * thickness) << IM_COL32_A_SHIFT);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const Vec2& p1 = points[i1];
            const Vec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= AA_SIZE;
            dy *= AA_SIZE;

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
            _VtxWritePtr[1].pos.x = p1.x     ; _VtxWritePtr[1].pos.y = p1.y     ; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_faded;
            _VtxWritePtr[2].pos.x = p1.x - dy; _VtxWritePtr[2].pos.y = p1.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;

            _VtxWritePtr[3].pos.x = p2.x + dy; _VtxWritePtr[3].pos.y = p2.y - dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
            _VtxWritePtr[4].pos.x = p2.x     ; _VtxWritePtr[4].pos.y = p2.y     ; _VtxWritePtr[4].uv = uv; _VtxWritePtr[4].col = col_faded;
            _VtxWritePtr[5].pos.x = p2.x - dy; _VtxWritePtr[5].pos.y = p2.y + dx; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
            _VtxWritePtr += 6;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+4); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr[6] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[7] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[8] = (ImDrawIdx)(_VtxCurrentIdx+5);
            _IdxWritePtr[9] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[10] = (ImDrawIdx)(_VtxCurrentIdx+5); _IdxWritePtr[11] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr += 12;
            _VtxCurrentIdx += 6;
        }
    }
    else
    {
        // Precise line with bevels on acute angles
        const int max_n_vtx = antialias ? 6 : 3;
        const int max_n_idx = 3 * (antialias ? 9 : 3);
        const int vtx_count = points_count * max_n_vtx;
        const int idx_count = count * max_n_idx;
        PrimReserve(idx_count, vtx_count);

        const float half_thickness = (antialias ? thickness - AA_SIZE : thickness) * 0.5f;
        const float half_thickness_aa = half_thickness + AA_SIZE;
        unsigned int first_vtx_ptr = _VtxCurrentIdx;
        unsigned int unused_vertices = 0;
        unsigned int unused_indices = 0;

        float sqlen1 = 0.0f;
        float dx1, dy1;
        if (closed)
        {
            dx1 = points[0].x - points[points_count-1].x;
            dy1 = points[0].y - points[points_count-1].y;
            sqlen1 = dx1 * dx1 + dy1 * dy1;
            IM_NORMALIZE2F_OVER_ZERO(dx1, dy1);
        }

        for (int i1 = 0; i1 < points_count; i1++)
        {
            const Vec2& p1 = points[i1];
            const int i2 = (i1 + 1 == points_count) ? 0 : i1 + 1;
            const Vec2& p2 = points[i2];
            float dx2 = p1.x - p2.x;
            float dy2 = p1.y - p2.y;
            float sqlen2 = dx2 * dx2 + dy2 * dy2;
            IM_NORMALIZE2F_OVER_ZERO(dx2, dy2);

            if (!closed && i1 == 0)
            {
                dx1 = -dx2;
                dy1 = -dy2;
                sqlen1 = sqlen2;
            }
            else if (!closed && i1 == points_count-1)
            {
                dx2 = -dx1;
                dy2 = -dy1;
                sqlen2 = sqlen1;
            }

            float miter_l_recip = dx1 * dy2 - dy1 * dx2;
            float mlx, mly, mrx, mry;     // Left and right miters
            float mlax, mlay, mrax, mray; // Left and right miters including anti-aliasing
            const bool bevel = (dx1 * dx2 + dy1 * dy2) > 1e-5f;
            if (ImFabs(miter_l_recip) > 1e-5f)
            {
                float miter_l = half_thickness / miter_l_recip;
                // Limit (inner) miter so it doesn't shoot away when miter is longer than adjacent line segments on acute angles
                if (bevel)
                {
                    // This is too aggressive (not exactly precise)
                    float min_sqlen = sqlen1 > sqlen2 ? sqlen2 : sqlen1;
                    float miter_sqlen = ((dx1 + dx2) * (dx1 + dx2) + (dy1 + dy2) * (dy1 + dy2)) * miter_l * miter_l;
                    if (miter_sqlen > min_sqlen)
                        miter_l *= ImSqrt(min_sqlen / miter_sqlen);
                }
                mlx = p1.x - (dx1 + dx2) * miter_l;
                mly = p1.y - (dy1 + dy2) * miter_l;
                mrx = p1.x + (dx1 + dx2) * miter_l;
                mry = p1.y + (dy1 + dy2) * miter_l;
                if (antialias)
                {
                    float miter_al = half_thickness_aa / miter_l_recip;
                    mlax = p1.x - (dx1 + dx2) * miter_al;
                    mlay = p1.y - (dy1 + dy2) * miter_al;
                    mrax = p1.x + (dx1 + dx2) * miter_al;
                    mray = p1.y + (dy1 + dy2) * miter_al;
                }
            }
            else
            {
                // Avoid degeneracy for (nearly) straight lines
                mlx = p1.x + dy1 * half_thickness;
                mly = p1.y - dx1 * half_thickness;
                mrx = p1.x - dy1 * half_thickness;
                mry = p1.y + dx1 * half_thickness;
                if (antialias)
                {
                    mlax = p1.x + dy1 * half_thickness_aa;
                    mlay = p1.y - dx1 * half_thickness_aa;
                    mrax = p1.x - dy1 * half_thickness_aa;
                    mray = p1.y + dx1 * half_thickness_aa;
                }
            }
            // The two bevel vertices if the angle is right or obtuse
            // miter_sign == 1, iff the outer (maybe bevelled) edge is on the right, -1 iff it is on the left
            int miter_sign = (miter_l_recip >= 0) - (miter_l_recip < 0);
            float b1x, b1y, b2x, b2y;     // First and second bevel point
            float b1ax, b1ay, b2ax, b2ay; // First and second bevel point including anti-aliasing
            if (bevel)
            {
                // FIXME-OPT: benchmark if doing these computations only once in AA case saves cycles
                b1x = p1.x + (dx1 - dy1 * miter_sign) * half_thickness;
                b1y = p1.y + (dy1 + dx1 * miter_sign) * half_thickness;
                b2x = p1.x + (dx2 + dy2 * miter_sign) * half_thickness;
                b2y = p1.y + (dy2 - dx2 * miter_sign) * half_thickness;
                if (antialias)
                {
                    b1ax = p1.x + (dx1 - dy1 * miter_sign) * half_thickness_aa;
                    b1ay = p1.y + (dy1 + dx1 * miter_sign) * half_thickness_aa;
                    b2ax = p1.x + (dx2 + dy2 * miter_sign) * half_thickness_aa;
                    b2ay = p1.y + (dy2 - dx2 * miter_sign) * half_thickness_aa;
                }
            }

            // Set the previous line direction so it doesn't need to be recomputed
            dx1 = -dx2;
            dy1 = -dy2;
            sqlen1 = sqlen2;

            // Now that we have all the point coordinates, put them into buffers

            // Vertices for each point are ordered in vertex buffer like this (looking in the direction of the polyline):
            // - left vertex*
            // - right vertex*
            // - left vertex AA fringe*  (if antialias)
            // - right vertex AA fringe* (if antialias)
            // - the remaining vertex (if bevel)
            // - the remaining vertex AA fringe (if bevel and antialias)
            // (*) if there is bevel, these vertices are the ones on the incoming edge.
            // Having all the vertices of the incoming edge in predictable positions is important - we reference them
            // even if we don't know relevant line properties yet

            int vertex_count = antialias ? (bevel ? 6 : 4) : (bevel ? 3 : 2); // FIXME: shorten the expression
            unsigned int bi = antialias ? 4 : 2; // Outgoing edge bevel vertex index
            const bool bevel_l = bevel && miter_sign < 0;
            const bool bevel_r = bevel && miter_sign > 0;

            _VtxWritePtr[0].pos.x = bevel_l ? b1x : mlx; _VtxWritePtr[0].pos.y = bevel_l ? b1y : mly; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = bevel_r ? b1x : mrx; _VtxWritePtr[1].pos.y = bevel_r ? b1y : mry; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            if (bevel)
            {
                _VtxWritePtr[bi].pos.x = b2x; _VtxWritePtr[bi].pos.y = b2y; _VtxWritePtr[bi].uv = uv; _VtxWritePtr[bi].col = col;
            }

            if (antialias)
            {
                _VtxWritePtr[2].pos.x = bevel_l ? b1ax : mlax; _VtxWritePtr[2].pos.y = bevel_l ? b1ay : mlay; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr[3].pos.x = bevel_r ? b1ax : mrax; _VtxWritePtr[3].pos.y = bevel_r ? b1ay : mray; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                if (bevel)
                {
                    _VtxWritePtr[5].pos.x = b2ax; _VtxWritePtr[5].pos.y = b2ay; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
                }
            }
            unused_vertices += max_n_vtx - vertex_count;
            _VtxWritePtr += vertex_count;

            if (i1 < count)
            {
                const int vtx_next_id = i1 < points_count-1 ? _VtxCurrentIdx+vertex_count : first_vtx_ptr;
                unsigned int l1i = _VtxCurrentIdx + (bevel_l ? bi : 0);
                unsigned int r1i = _VtxCurrentIdx + (bevel_r ? bi : 1);
                unsigned int l2i = vtx_next_id;
                unsigned int r2i = vtx_next_id + 1;
                unsigned int ebi = _VtxCurrentIdx + (bevel_l ? 0 : 1); // incoming edge bevel vertex index

                _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)r2i;
                _IdxWritePtr[3] = (ImDrawIdx)l1i; _IdxWritePtr[4] = (ImDrawIdx)r2i; _IdxWritePtr[5] = (ImDrawIdx)l2i;
                _IdxWritePtr += 6;

                if (bevel)
                {
                    _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)ebi;
                    _IdxWritePtr += 3;
                }
                else
                    unused_indices += 3;

                if (antialias)
                {
                    unsigned int l1ai = _VtxCurrentIdx + (bevel_l ? 5 : 2);
                    unsigned int r1ai = _VtxCurrentIdx + (bevel_r ? 5 : 3);
                    unsigned int l2ai = vtx_next_id + 2;
                    unsigned int r2ai = vtx_next_id + 3;

                    _IdxWritePtr[0] = (ImDrawIdx)l1ai; _IdxWritePtr[1]  = (ImDrawIdx)l1i; _IdxWritePtr[2]  = (ImDrawIdx)l2i;
                    _IdxWritePtr[3] = (ImDrawIdx)l1ai; _IdxWritePtr[4]  = (ImDrawIdx)l2i; _IdxWritePtr[5]  = (ImDrawIdx)l2ai;
                    _IdxWritePtr[6] = (ImDrawIdx)r1ai; _IdxWritePtr[7]  = (ImDrawIdx)r1i; _IdxWritePtr[8]  = (ImDrawIdx)r2i;
                    _IdxWritePtr[9] = (ImDrawIdx)r1ai; _IdxWritePtr[10] = (ImDrawIdx)r2i; _IdxWritePtr[11] = (ImDrawIdx)r2ai;
                    _IdxWritePtr += 12;

                    if (bevel)
                    {
                        _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 3 : 0));
                        _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));

                        _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));
                        _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 4 : 5));
                        _IdxWritePtr += 6;
                    }
                    else
                    {
                        unused_indices += 6;
                    }
                }
            }
            _VtxCurrentIdx += vertex_count;
        }
        PrimUnreserve((int)unused_indices, (int)unused_vertices);
    }
}